

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O0

string * gmlc::utilities::stringOps::getTailString_abi_cxx11_(string_view input,string_view sep)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  char *in_RDX;
  size_t in_RSI;
  string *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  string_view ret;
  size_type sepLoc;
  size_type in_stack_ffffffffffffff78;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  string *this;
  allocator<char> local_51;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  size_t local_18;
  char *local_10;
  
  __str._M_str = in_stack_ffffffffffffff90;
  __str._M_len = in_stack_ffffffffffffff88;
  this = in_RDI;
  local_18 = in_RSI;
  local_10 = in_RDX;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                    (in_stack_ffffffffffffff80,__str,in_stack_ffffffffffffff78);
  bVar2._M_str = local_10;
  bVar2._M_len = local_18;
  if (sVar1 != 0xffffffffffffffff) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_28);
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)this,(size_type)in_RDI,
                       (size_type)in_stack_ffffffffffffff90);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_RCX,(basic_string_view<char,_std::char_traits<char>_> *)bVar2._M_str,
             (allocator<char> *)bVar2._M_len);
  std::allocator<char>::~allocator(&local_51);
  return this;
}

Assistant:

std::string
        getTailString(std::string_view input, std::string_view sep) noexcept
    {
        auto sepLoc = input.rfind(sep);
        std::string_view ret = (sepLoc == std::string_view::npos) ?
            input :
            input.substr(sepLoc + sep.size());
        return std::string(ret);
    }